

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O0

int usage(char *prg,char *msg,int res)

{
  ostream *poVar1;
  int res_local;
  char *msg_local;
  char *prg_local;
  
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,msg);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"  ");
  poVar1 = std::operator<<(poVar1,prg);
  poVar1 = std::operator<<(poVar1," output_file input_file cpp_var_name");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return res;
}

Assistant:

int usage( const char *prg, const char *msg, int res ) {
    if ( msg )
        std::cerr << msg << std::endl;
    std::cerr << "Usage:" << std::endl;
    std::cerr << "  " << prg << " output_file input_file cpp_var_name" << std::endl;
    return res;
}